

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O0

protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *
protobuf_test_messages_proto2_TestAllTypesProto2_mutable_optional_nested_message
          (protobuf_test_messages_proto2_TestAllTypesProto2 *msg,upb_Arena *arena)

{
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *local_20;
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *sub;
  upb_Arena *arena_local;
  protobuf_test_messages_proto2_TestAllTypesProto2 *msg_local;
  
  local_20 = protobuf_test_messages_proto2_TestAllTypesProto2_optional_nested_message(msg);
  if ((local_20 == (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *)0x0) &&
     (local_20 = (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *)
                 _upb_Message_New(&
                                  protobuf_0test_0messages__proto2__TestAllTypesProto2__NestedMessage_msg_init
                                  ,arena),
     local_20 != (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *)0x0)) {
    protobuf_test_messages_proto2_TestAllTypesProto2_set_optional_nested_message(msg,local_20);
  }
  return local_20;
}

Assistant:

UPB_INLINE struct protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* protobuf_test_messages_proto2_TestAllTypesProto2_mutable_optional_nested_message(protobuf_test_messages_proto2_TestAllTypesProto2* msg, upb_Arena* arena) {
  struct protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* sub = (struct protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage*)protobuf_test_messages_proto2_TestAllTypesProto2_optional_nested_message(msg);
  if (sub == NULL) {
    sub = (struct protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage*)_upb_Message_New(&protobuf_0test_0messages__proto2__TestAllTypesProto2__NestedMessage_msg_init, arena);
    if (sub) protobuf_test_messages_proto2_TestAllTypesProto2_set_optional_nested_message(msg, sub);
  }
  return sub;
}